

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_sys_cfg_test.c
# Opt level: O1

int main(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  undefined8 uVar6;
  MppSysCfg cfg;
  RK_U32 size_fbc_bdy;
  RK_U32 size_fbc_hdr;
  RK_U32 size_total;
  RK_U32 v_stride;
  RK_U32 h_stride_by_pixel;
  RK_U32 h_stride_by_byte;
  undefined8 local_30;
  undefined1 local_28 [4];
  undefined1 local_24 [4];
  undefined1 local_20 [4];
  undefined1 local_1c [4];
  undefined1 local_18 [4];
  undefined1 local_14 [4];
  
  mpp_sys_cfg_show();
  _mpp_log_l(4,"mpp_sys_cfg_test","mpp_sys_cfg_test start\n",0);
  lVar3 = mpp_time();
  iVar1 = mpp_sys_cfg_get(&local_30);
  if (iVar1 == 0) {
    mpp_sys_cfg_set_u32(local_30,"dec_buf_chk:type",1);
    mpp_sys_cfg_set_u32(local_30,"dec_buf_chk:enable",1);
    mpp_sys_cfg_set_u32(local_30,"dec_buf_chk:type",0x1000004);
    iVar1 = 0;
    mpp_sys_cfg_set_u32(local_30,"dec_buf_chk:fmt_codec",0);
    mpp_sys_cfg_set_u32(local_30,"dec_buf_chk:fmt_fbc",0x100000);
    mpp_sys_cfg_set_u32(local_30,"dec_buf_chk:width",0x1000);
    mpp_sys_cfg_set_u32(local_30,"dec_buf_chk:height",0x900);
    mpp_sys_cfg_set_u32(local_30,"dec_buf_chk:h_stride_by_byte",0);
    mpp_sys_cfg_set_u32(local_30,"dec_buf_chk:h_stride_by_pixel",0);
    iVar2 = mpp_sys_cfg_set_u32(local_30,"dec_buf_chk:cap_fbc",1);
    if (iVar2 != 0) {
      mpp_sys_cfg_ioctl(local_30);
      mpp_sys_cfg_get_u32(local_30,"dec_buf_chk:h_stride_by_byte",local_14);
      mpp_sys_cfg_get_u32(local_30,"dec_buf_chk:h_stride_by_pixel",local_18);
      mpp_sys_cfg_get_u32(local_30,"dec_buf_chk:v_stride",local_1c);
      mpp_sys_cfg_get_u32(local_30,"dec_buf_chk:size_total",local_20);
      mpp_sys_cfg_get_u32(local_30,"dec_buf_chk:size_fbc_hdr",local_24);
      mpp_sys_cfg_get_u32(local_30,"dec_buf_chk:size_fbc_bdy",local_28);
      iVar1 = mpp_sys_cfg_put(local_30);
      if (iVar1 == 0) {
        iVar1 = 0;
        lVar4 = mpp_time();
        _mpp_log_l(4,"mpp_sys_cfg_test","set u32 time %lld us\n",0,lVar4 - lVar3);
        goto LAB_0010120b;
      }
      pcVar5 = "mpp_sys_cfg_put failed\n";
      goto LAB_001011fd;
    }
    pcVar5 = "set readonly success, should be a failure\n";
    uVar6 = 4;
  }
  else {
    pcVar5 = "mpp_sys_cfg_get failed\n";
LAB_001011fd:
    uVar6 = 2;
  }
  _mpp_log_l(uVar6,"mpp_sys_cfg_test",pcVar5,0);
LAB_0010120b:
  pcVar5 = "failed";
  if (iVar1 == 0) {
    pcVar5 = "success";
  }
  _mpp_log_l(4,"mpp_sys_cfg_test","mpp_sys_cfg_test done %s\n",0,pcVar5);
  return iVar1;
}

Assistant:

int main()
{
    MPP_RET ret = MPP_OK;
    MppSysCfg cfg;
    RK_S64 end = 0;
    RK_S64 start = 0;
    MppCodingType type = MPP_VIDEO_CodingHEVC;
    RK_U32 width = 4096;
    RK_U32 height = 2304;
    RK_U32 h_stride_by_byte;
    RK_U32 h_stride_by_pixel;
    RK_U32 v_stride;
    RK_U32 size_total;
    RK_U32 size_fbc_hdr;
    RK_U32 size_fbc_bdy;

    mpp_sys_cfg_show();

    mpp_log("mpp_sys_cfg_test start\n");

    start = mpp_time();

    ret = mpp_sys_cfg_get(&cfg);
    if (ret) {
        mpp_err("mpp_sys_cfg_get failed\n");
        goto DONE;
    }

    /* set correct parameter */
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:type", 1);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:enable", 1);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:type", type);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:fmt_codec", MPP_FMT_YUV420SP);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:fmt_fbc", MPP_FRAME_FBC_AFBC_V1);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:width", width);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:height", height);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:h_stride_by_byte", 0);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:h_stride_by_pixel", 0);

    /* try get readonly parameter */
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:cap_fbc", 1);
    if (!ret) {
        mpp_log("set readonly success, should be a failure\n");
        goto DONE;
    }

    /* get result */
    mpp_sys_cfg_ioctl(cfg);

    ret = mpp_sys_cfg_get_u32(cfg, "dec_buf_chk:h_stride_by_byte", &h_stride_by_byte);
    ret = mpp_sys_cfg_get_u32(cfg, "dec_buf_chk:h_stride_by_pixel", &h_stride_by_pixel);
    ret = mpp_sys_cfg_get_u32(cfg, "dec_buf_chk:v_stride", &v_stride);
    ret = mpp_sys_cfg_get_u32(cfg, "dec_buf_chk:size_total", &size_total);
    ret = mpp_sys_cfg_get_u32(cfg, "dec_buf_chk:size_fbc_hdr", &size_fbc_hdr);
    ret = mpp_sys_cfg_get_u32(cfg, "dec_buf_chk:size_fbc_bdy", &size_fbc_bdy);

    ret = mpp_sys_cfg_put(cfg);
    if (ret) {
        mpp_err("mpp_sys_cfg_put failed\n");
        goto DONE;
    }

    end = mpp_time();
    mpp_log("set u32 time %lld us\n", end - start);

DONE:
    mpp_log("mpp_sys_cfg_test done %s\n", ret ? "failed" : "success");
    return ret;
}